

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void windowCodeRowExprStep(Parse *pParse,Select *p,WhereInfo *pWInfo,int regGosub,int addrGosub)

{
  long lVar1;
  long lVar2;
  long lVar3;
  long lVar4;
  i64 iVar5;
  Vdbe *pVVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  int local_70;
  int lblSkipInverse;
  int regSize;
  int addrIfPos2;
  int addrIfPos1;
  int addrTop;
  int addrGoto;
  int regEnd;
  int regStart;
  int csrEnd;
  int csrStart;
  int addr;
  int regArg;
  int lblFlushDone;
  int lblFlushPart;
  int regFlushPart;
  Vdbe *v;
  Window *pMWin;
  int addrGosub_local;
  int regGosub_local;
  WhereInfo *pWInfo_local;
  Select *p_local;
  Parse *pParse_local;
  
  v = (Vdbe *)p->pWin;
  pMWin._0_4_ = addrGosub;
  pMWin._4_4_ = regGosub;
  _addrGosub_local = pWInfo;
  pWInfo_local = (WhereInfo *)p;
  p_local = (Select *)pParse;
  _lblFlushPart = sqlite3GetVdbe(pParse);
  regStart = *(int *)((long)&p_local->pWhere + 4);
  *(int *)((long)&p_local->pWhere + 4) = regStart + 1;
  regEnd = *(int *)((long)&p_local->pWhere + 4);
  *(int *)((long)&p_local->pWhere + 4) = regEnd + 1;
  regSize = 0;
  lblSkipInverse = 0;
  local_70 = 0;
  lblFlushDone = *(int *)&p_local->pGroupBy + 1;
  *(int *)&p_local->pGroupBy = lblFlushDone;
  regArg = sqlite3VdbeMakeLabel(_lblFlushPart);
  addr = sqlite3VdbeMakeLabel(_lblFlushPart);
  addrGoto = *(int *)&p_local->pGroupBy + 1;
  *(int *)&p_local->pGroupBy = addrGoto;
  addrTop = *(int *)&p_local->pGroupBy + 1;
  *(int *)&p_local->pGroupBy = addrTop;
  windowPartitionCache
            ((Parse *)p_local,(Select *)pWInfo_local,_addrGosub_local,lblFlushDone,regArg,&local_70)
  ;
  addrIfPos1 = sqlite3VdbeAddOp0(_lblFlushPart,0xb);
  sqlite3VdbeResolveLabel(_lblFlushPart,regArg);
  pVVar6 = _lblFlushPart;
  iVar7 = sqlite3VdbeCurrentAddr(_lblFlushPart);
  sqlite3VdbeAddOp2(pVVar6,0x11,0,iVar7 + 3);
  sqlite3VdbeAddOp2(_lblFlushPart,0x6f,regStart,(int)v->iCurrentTime);
  sqlite3VdbeAddOp2(_lblFlushPart,0x6f,regEnd,(int)v->iCurrentTime);
  lVar1._0_2_ = v->nVar;
  lVar1._2_2_ = *(undefined2 *)&v->field_0x22;
  lVar1._4_4_ = v->magic;
  if (lVar1 != 0) {
    sqlite3ExprCode((Parse *)p_local,*(Expr **)&v->nVar,addrGoto);
    windowCheckIntValue((Parse *)p_local,addrGoto,0);
  }
  lVar2._0_4_ = v->nMem;
  lVar2._4_4_ = v->nCursor;
  if (lVar2 != 0) {
    sqlite3ExprCode((Parse *)p_local,*(Expr **)&v->nMem,addrTop);
    windowCheckIntValue((Parse *)p_local,addrTop,1);
  }
  pVVar6 = _lblFlushPart;
  iVar7 = addrGoto;
  lVar3._0_4_ = v->nMem;
  lVar3._4_4_ = v->nCursor;
  if ((lVar3 != 0) && (*(char *)((long)&v->pParse + 1) == 'S')) {
    iVar8 = sqlite3VdbeCurrentAddr(_lblFlushPart);
    sqlite3VdbeAddOp3(pVVar6,0x39,iVar7,iVar8 + 2,addrTop);
    sqlite3VdbeAddOp2(_lblFlushPart,0x4e,local_70,addrGoto);
    sqlite3VdbeAddOp3(_lblFlushPart,0x61,addrGoto,addrTop,addrTop);
  }
  pVVar6 = _lblFlushPart;
  iVar7 = addrGoto;
  lVar4._0_2_ = v->nVar;
  lVar4._2_2_ = *(undefined2 *)&v->field_0x22;
  lVar4._4_4_ = v->magic;
  if ((lVar4 != 0) && (*(char *)((long)&v->pParse + 2) == 'U')) {
    iVar8 = sqlite3VdbeCurrentAddr(_lblFlushPart);
    sqlite3VdbeAddOp3(pVVar6,0x37,iVar7,iVar8 + 3,addrTop);
    sqlite3VdbeAddOp2(_lblFlushPart,0x4e,local_70,addrGoto);
    sqlite3VdbeAddOp2(_lblFlushPart,0x4e,local_70,addrTop);
  }
  csrStart = windowInitAccum((Parse *)p_local,(Window *)v);
  sqlite3VdbeAddOp2(_lblFlushPart,0x24,(int)v->iCurrentTime,addr);
  sqlite3VdbeAddOp2(_lblFlushPart,0x24,regStart,addr);
  sqlite3VdbeChangeP5(_lblFlushPart,1);
  sqlite3VdbeAddOp2(_lblFlushPart,0x24,regEnd,addr);
  sqlite3VdbeChangeP5(_lblFlushPart,1);
  addrIfPos2 = sqlite3VdbeCurrentAddr(_lblFlushPart);
  if (*(char *)((long)&v->pParse + 2) == 'U') {
    regSize = sqlite3VdbeAddOp3(_lblFlushPart,0x2f,addrTop,0,1);
  }
  pVVar6 = _lblFlushPart;
  iVar7 = regEnd;
  iVar8 = sqlite3VdbeCurrentAddr(_lblFlushPart);
  sqlite3VdbeAddOp2(pVVar6,5,iVar7,iVar8 + 2);
  csrEnd = sqlite3VdbeAddOp0(_lblFlushPart,0xb);
  windowAggStep((Parse *)p_local,(Window *)v,regEnd,0,csrStart,local_70);
  if (*(char *)((long)&v->pParse + 2) == 'W') {
    sqlite3VdbeAddOp2(_lblFlushPart,0xb,0,addrIfPos2);
    sqlite3VdbeJumpHere(_lblFlushPart,csrEnd);
    addrIfPos2 = sqlite3VdbeCurrentAddr(_lblFlushPart);
  }
  else {
    sqlite3VdbeJumpHere(_lblFlushPart,csrEnd);
    if (*(char *)((long)&v->pParse + 2) == 'U') {
      sqlite3VdbeJumpHere(_lblFlushPart,regSize);
    }
  }
  if (*(char *)((long)&v->pParse + 2) == 'S') {
    regSize = sqlite3VdbeAddOp3(_lblFlushPart,0x2f,addrTop,0,1);
  }
  if (*(char *)((long)&v->pParse + 1) == 'S') {
    lblSkipInverse = sqlite3VdbeAddOp3(_lblFlushPart,0x2f,addrGoto,0,1);
  }
  windowAggFinal((Parse *)p_local,(Window *)v,0);
  windowReturnOneRow((Parse *)p_local,(Window *)v,pMWin._4_4_,(int)pMWin);
  pVVar6 = _lblFlushPart;
  iVar5 = v->iCurrentTime;
  iVar7 = sqlite3VdbeCurrentAddr(_lblFlushPart);
  sqlite3VdbeAddOp2(pVVar6,5,(int)iVar5,iVar7 + 2);
  sqlite3VdbeAddOp2(_lblFlushPart,0xb,0,addr);
  if (*(char *)((long)&v->pParse + 1) == 'S') {
    sqlite3VdbeJumpHere(_lblFlushPart,lblSkipInverse);
  }
  if (((*(char *)((long)&v->pParse + 1) == 'R') || (*(char *)((long)&v->pParse + 1) == 'U')) ||
     (*(char *)((long)&v->pParse + 1) == 'S')) {
    iVar7 = sqlite3VdbeMakeLabel(_lblFlushPart);
    if (*(char *)((long)&v->pParse + 1) == 'U') {
      sqlite3VdbeAddOp3(_lblFlushPart,0x2f,addrGoto,iVar7,1);
    }
    pVVar6 = _lblFlushPart;
    iVar8 = regStart;
    if (*(char *)((long)&v->pParse + 1) == 'S') {
      iVar9 = sqlite3VdbeCurrentAddr(_lblFlushPart);
      sqlite3VdbeAddOp2(pVVar6,5,iVar8,iVar9 + 2);
      sqlite3VdbeAddOp2(_lblFlushPart,0xb,0,iVar7);
    }
    else {
      iVar9 = sqlite3VdbeCurrentAddr(_lblFlushPart);
      sqlite3VdbeAddOp2(pVVar6,5,iVar8,iVar9 + 1);
    }
    windowAggStep((Parse *)p_local,(Window *)v,regStart,1,csrStart,local_70);
    sqlite3VdbeResolveLabel(_lblFlushPart,iVar7);
  }
  if (*(char *)((long)&v->pParse + 2) == 'S') {
    sqlite3VdbeJumpHere(_lblFlushPart,regSize);
  }
  sqlite3VdbeAddOp2(_lblFlushPart,0xb,0,addrIfPos2);
  sqlite3VdbeResolveLabel(_lblFlushPart,addr);
  sqlite3VdbeAddOp1(_lblFlushPart,0x8b,(int)v->iCurrentTime);
  sqlite3VdbeAddOp1(_lblFlushPart,0x42,lblFlushDone);
  sqlite3VdbeJumpHere(_lblFlushPart,addrIfPos1);
  return;
}

Assistant:

static void windowCodeRowExprStep(
  Parse *pParse, 
  Select *p,
  WhereInfo *pWInfo,
  int regGosub, 
  int addrGosub
){
  Window *pMWin = p->pWin;
  Vdbe *v = sqlite3GetVdbe(pParse);
  int regFlushPart;               /* Register for "Gosub flush_partition" */
  int lblFlushPart;               /* Label for "Gosub flush_partition" */
  int lblFlushDone;               /* Label for "Gosub flush_partition_done" */

  int regArg;
  int addr;
  int csrStart = pParse->nTab++;
  int csrEnd = pParse->nTab++;
  int regStart;                    /* Value of <expr> PRECEDING */
  int regEnd;                      /* Value of <expr> FOLLOWING */
  int addrGoto;
  int addrTop;
  int addrIfPos1 = 0;
  int addrIfPos2 = 0;
  int regSize = 0;

  assert( pMWin->eStart==TK_PRECEDING 
       || pMWin->eStart==TK_CURRENT 
       || pMWin->eStart==TK_FOLLOWING 
       || pMWin->eStart==TK_UNBOUNDED 
  );
  assert( pMWin->eEnd==TK_FOLLOWING 
       || pMWin->eEnd==TK_CURRENT 
       || pMWin->eEnd==TK_UNBOUNDED 
       || pMWin->eEnd==TK_PRECEDING 
  );

  /* Allocate register and label for the "flush_partition" sub-routine. */
  regFlushPart = ++pParse->nMem;
  lblFlushPart = sqlite3VdbeMakeLabel(v);
  lblFlushDone = sqlite3VdbeMakeLabel(v);

  regStart = ++pParse->nMem;
  regEnd = ++pParse->nMem;

  windowPartitionCache(pParse, p, pWInfo, regFlushPart, lblFlushPart, &regSize);

  addrGoto = sqlite3VdbeAddOp0(v, OP_Goto);

  /* Start of "flush_partition" */
  sqlite3VdbeResolveLabel(v, lblFlushPart);
  sqlite3VdbeAddOp2(v, OP_Once, 0, sqlite3VdbeCurrentAddr(v)+3);
  VdbeCoverage(v);
  VdbeComment((v, "Flush_partition subroutine"));
  sqlite3VdbeAddOp2(v, OP_OpenDup, csrStart, pMWin->iEphCsr);
  sqlite3VdbeAddOp2(v, OP_OpenDup, csrEnd, pMWin->iEphCsr);

  /* If either regStart or regEnd are not non-negative integers, throw 
  ** an exception.  */
  if( pMWin->pStart ){
    sqlite3ExprCode(pParse, pMWin->pStart, regStart);
    windowCheckIntValue(pParse, regStart, 0);
  }
  if( pMWin->pEnd ){
    sqlite3ExprCode(pParse, pMWin->pEnd, regEnd);
    windowCheckIntValue(pParse, regEnd, 1);
  }

  /* If this is "ROWS <expr1> FOLLOWING AND ROWS <expr2> FOLLOWING", do:
  **
  **   if( regEnd<regStart ){
  **     // The frame always consists of 0 rows
  **     regStart = regSize;
  **   }
  **   regEnd = regEnd - regStart;
  */
  if( pMWin->pEnd && pMWin->eStart==TK_FOLLOWING ){
    assert( pMWin->pStart!=0 );
    assert( pMWin->eEnd==TK_FOLLOWING );
    sqlite3VdbeAddOp3(v, OP_Ge, regStart, sqlite3VdbeCurrentAddr(v)+2, regEnd);
    VdbeCoverageNeverNull(v);
    sqlite3VdbeAddOp2(v, OP_Copy, regSize, regStart);
    sqlite3VdbeAddOp3(v, OP_Subtract, regStart, regEnd, regEnd);
  }

  if( pMWin->pStart && pMWin->eEnd==TK_PRECEDING ){
    assert( pMWin->pEnd!=0 );
    assert( pMWin->eStart==TK_PRECEDING );
    sqlite3VdbeAddOp3(v, OP_Le, regStart, sqlite3VdbeCurrentAddr(v)+3, regEnd);
    VdbeCoverageNeverNull(v);
    sqlite3VdbeAddOp2(v, OP_Copy, regSize, regStart);
    sqlite3VdbeAddOp2(v, OP_Copy, regSize, regEnd);
  }

  /* Initialize the accumulator register for each window function to NULL */
  regArg = windowInitAccum(pParse, pMWin);

  sqlite3VdbeAddOp2(v, OP_Rewind, pMWin->iEphCsr, lblFlushDone);
  VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_Rewind, csrStart, lblFlushDone);
  VdbeCoverageNeverTaken(v);
  sqlite3VdbeChangeP5(v, 1);
  sqlite3VdbeAddOp2(v, OP_Rewind, csrEnd, lblFlushDone);
  VdbeCoverageNeverTaken(v);
  sqlite3VdbeChangeP5(v, 1);

  /* Invoke AggStep function for each window function using the row that
  ** csrEnd currently points to. Or, if csrEnd is already at EOF,
  ** do nothing.  */
  addrTop = sqlite3VdbeCurrentAddr(v);
  if( pMWin->eEnd==TK_PRECEDING ){
    addrIfPos1 = sqlite3VdbeAddOp3(v, OP_IfPos, regEnd, 0 , 1);
    VdbeCoverage(v);
  }
  sqlite3VdbeAddOp2(v, OP_Next, csrEnd, sqlite3VdbeCurrentAddr(v)+2);
  VdbeCoverage(v);
  addr = sqlite3VdbeAddOp0(v, OP_Goto);
  windowAggStep(pParse, pMWin, csrEnd, 0, regArg, regSize);
  if( pMWin->eEnd==TK_UNBOUNDED ){
    sqlite3VdbeAddOp2(v, OP_Goto, 0, addrTop);
    sqlite3VdbeJumpHere(v, addr);
    addrTop = sqlite3VdbeCurrentAddr(v);
  }else{
    sqlite3VdbeJumpHere(v, addr);
    if( pMWin->eEnd==TK_PRECEDING ){
      sqlite3VdbeJumpHere(v, addrIfPos1);
    }
  }

  if( pMWin->eEnd==TK_FOLLOWING ){
    addrIfPos1 = sqlite3VdbeAddOp3(v, OP_IfPos, regEnd, 0 , 1);
    VdbeCoverage(v);
  }
  if( pMWin->eStart==TK_FOLLOWING ){
    addrIfPos2 = sqlite3VdbeAddOp3(v, OP_IfPos, regStart, 0 , 1);
    VdbeCoverage(v);
  }
  windowAggFinal(pParse, pMWin, 0);
  windowReturnOneRow(pParse, pMWin, regGosub, addrGosub);
  sqlite3VdbeAddOp2(v, OP_Next, pMWin->iEphCsr, sqlite3VdbeCurrentAddr(v)+2);
  VdbeCoverage(v);
  sqlite3VdbeAddOp2(v, OP_Goto, 0, lblFlushDone);
  if( pMWin->eStart==TK_FOLLOWING ){
    sqlite3VdbeJumpHere(v, addrIfPos2);
  }

  if( pMWin->eStart==TK_CURRENT 
   || pMWin->eStart==TK_PRECEDING 
   || pMWin->eStart==TK_FOLLOWING 
  ){
    int lblSkipInverse = sqlite3VdbeMakeLabel(v);;
    if( pMWin->eStart==TK_PRECEDING ){
      sqlite3VdbeAddOp3(v, OP_IfPos, regStart, lblSkipInverse, 1);
      VdbeCoverage(v);
    }
    if( pMWin->eStart==TK_FOLLOWING ){
      sqlite3VdbeAddOp2(v, OP_Next, csrStart, sqlite3VdbeCurrentAddr(v)+2);
      VdbeCoverage(v);
      sqlite3VdbeAddOp2(v, OP_Goto, 0, lblSkipInverse);
    }else{
      sqlite3VdbeAddOp2(v, OP_Next, csrStart, sqlite3VdbeCurrentAddr(v)+1);
      VdbeCoverageAlwaysTaken(v);
    }
    windowAggStep(pParse, pMWin, csrStart, 1, regArg, regSize);
    sqlite3VdbeResolveLabel(v, lblSkipInverse);
  }
  if( pMWin->eEnd==TK_FOLLOWING ){
    sqlite3VdbeJumpHere(v, addrIfPos1);
  }
  sqlite3VdbeAddOp2(v, OP_Goto, 0, addrTop);

  /* flush_partition_done: */
  sqlite3VdbeResolveLabel(v, lblFlushDone);
  sqlite3VdbeAddOp1(v, OP_ResetSorter, pMWin->iEphCsr);
  sqlite3VdbeAddOp1(v, OP_Return, regFlushPart);
  VdbeComment((v, "end flush_partition subroutine"));

  /* Jump to here to skip over flush_partition */
  sqlite3VdbeJumpHere(v, addrGoto);
}